

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O0

tokenType icu_63::PluralRuleParser::getKeyType(UnicodeString *token,tokenType keyType)

{
  UnicodeString *pUVar1;
  int8_t iVar2;
  ConstChar16Ptr local_a0;
  ConstChar16Ptr local_98;
  ConstChar16Ptr local_90;
  ConstChar16Ptr local_88;
  ConstChar16Ptr local_80;
  ConstChar16Ptr local_78;
  ConstChar16Ptr local_70;
  ConstChar16Ptr local_68;
  ConstChar16Ptr local_60;
  ConstChar16Ptr local_58;
  ConstChar16Ptr local_50;
  ConstChar16Ptr local_48;
  ConstChar16Ptr local_40 [3];
  ConstChar16Ptr local_28;
  tokenType local_1c;
  UnicodeString *pUStack_18;
  tokenType keyType_local;
  UnicodeString *token_local;
  
  token_local._4_4_ = keyType;
  if (keyType == tKeyword) {
    local_1c = keyType;
    pUStack_18 = token;
    ConstChar16Ptr::ConstChar16Ptr(&local_28,L"n");
    iVar2 = UnicodeString::compare(token,&local_28,1);
    ConstChar16Ptr::~ConstChar16Ptr(&local_28);
    pUVar1 = pUStack_18;
    if (iVar2 == '\0') {
      local_1c = tVariableN;
    }
    else {
      ConstChar16Ptr::ConstChar16Ptr(local_40,L"i");
      iVar2 = UnicodeString::compare(pUVar1,local_40,1);
      ConstChar16Ptr::~ConstChar16Ptr(local_40);
      pUVar1 = pUStack_18;
      if (iVar2 == '\0') {
        local_1c = tVariableI;
      }
      else {
        ConstChar16Ptr::ConstChar16Ptr(&local_48,L"f");
        iVar2 = UnicodeString::compare(pUVar1,&local_48,1);
        ConstChar16Ptr::~ConstChar16Ptr(&local_48);
        pUVar1 = pUStack_18;
        if (iVar2 == '\0') {
          local_1c = tVariableF;
        }
        else {
          ConstChar16Ptr::ConstChar16Ptr(&local_50,L"t");
          iVar2 = UnicodeString::compare(pUVar1,&local_50,1);
          ConstChar16Ptr::~ConstChar16Ptr(&local_50);
          pUVar1 = pUStack_18;
          if (iVar2 == '\0') {
            local_1c = tVariableT;
          }
          else {
            ConstChar16Ptr::ConstChar16Ptr(&local_58,L"v");
            iVar2 = UnicodeString::compare(pUVar1,&local_58,1);
            ConstChar16Ptr::~ConstChar16Ptr(&local_58);
            pUVar1 = pUStack_18;
            if (iVar2 == '\0') {
              local_1c = tVariableV;
            }
            else {
              ConstChar16Ptr::ConstChar16Ptr(&local_60,L"is");
              iVar2 = UnicodeString::compare(pUVar1,&local_60,2);
              ConstChar16Ptr::~ConstChar16Ptr(&local_60);
              pUVar1 = pUStack_18;
              if (iVar2 == '\0') {
                local_1c = tIs;
              }
              else {
                ConstChar16Ptr::ConstChar16Ptr(&local_68,L"and");
                iVar2 = UnicodeString::compare(pUVar1,&local_68,3);
                ConstChar16Ptr::~ConstChar16Ptr(&local_68);
                pUVar1 = pUStack_18;
                if (iVar2 == '\0') {
                  local_1c = tAnd;
                }
                else {
                  ConstChar16Ptr::ConstChar16Ptr(&local_70,L"in");
                  iVar2 = UnicodeString::compare(pUVar1,&local_70,2);
                  ConstChar16Ptr::~ConstChar16Ptr(&local_70);
                  pUVar1 = pUStack_18;
                  if (iVar2 == '\0') {
                    local_1c = tIn;
                  }
                  else {
                    ConstChar16Ptr::ConstChar16Ptr(&local_78,(char16_t *)PK_WITHIN);
                    iVar2 = UnicodeString::compare(pUVar1,&local_78,6);
                    ConstChar16Ptr::~ConstChar16Ptr(&local_78);
                    pUVar1 = pUStack_18;
                    if (iVar2 == '\0') {
                      local_1c = tWithin;
                    }
                    else {
                      ConstChar16Ptr::ConstChar16Ptr(&local_80,L"not");
                      iVar2 = UnicodeString::compare(pUVar1,&local_80,3);
                      ConstChar16Ptr::~ConstChar16Ptr(&local_80);
                      pUVar1 = pUStack_18;
                      if (iVar2 == '\0') {
                        local_1c = tNot;
                      }
                      else {
                        ConstChar16Ptr::ConstChar16Ptr(&local_88,L"mod");
                        iVar2 = UnicodeString::compare(pUVar1,&local_88,3);
                        ConstChar16Ptr::~ConstChar16Ptr(&local_88);
                        pUVar1 = pUStack_18;
                        if (iVar2 == '\0') {
                          local_1c = tMod;
                        }
                        else {
                          ConstChar16Ptr::ConstChar16Ptr(&local_90,L"or");
                          iVar2 = UnicodeString::compare(pUVar1,&local_90,2);
                          ConstChar16Ptr::~ConstChar16Ptr(&local_90);
                          pUVar1 = pUStack_18;
                          if (iVar2 == '\0') {
                            local_1c = tOr;
                          }
                          else {
                            ConstChar16Ptr::ConstChar16Ptr(&local_98,(char16_t *)PK_DECIMAL);
                            iVar2 = UnicodeString::compare(pUVar1,&local_98,7);
                            ConstChar16Ptr::~ConstChar16Ptr(&local_98);
                            pUVar1 = pUStack_18;
                            if (iVar2 == '\0') {
                              local_1c = tDecimal;
                            }
                            else {
                              ConstChar16Ptr::ConstChar16Ptr(&local_a0,(char16_t *)PK_INTEGER);
                              iVar2 = UnicodeString::compare(pUVar1,&local_a0,7);
                              ConstChar16Ptr::~ConstChar16Ptr(&local_a0);
                              if (iVar2 == '\0') {
                                local_1c = tInteger;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    token_local._4_4_ = local_1c;
  }
  return token_local._4_4_;
}

Assistant:

tokenType
PluralRuleParser::getKeyType(const UnicodeString &token, tokenType keyType)
{
    if (keyType != tKeyword) {
        return keyType;
    }

    if (0 == token.compare(PK_VAR_N, 1)) {
        keyType = tVariableN;
    } else if (0 == token.compare(PK_VAR_I, 1)) {
        keyType = tVariableI;
    } else if (0 == token.compare(PK_VAR_F, 1)) {
        keyType = tVariableF;
    } else if (0 == token.compare(PK_VAR_T, 1)) {
        keyType = tVariableT;
    } else if (0 == token.compare(PK_VAR_V, 1)) {
        keyType = tVariableV;
    } else if (0 == token.compare(PK_IS, 2)) {
        keyType = tIs;
    } else if (0 == token.compare(PK_AND, 3)) {
        keyType = tAnd;
    } else if (0 == token.compare(PK_IN, 2)) {
        keyType = tIn;
    } else if (0 == token.compare(PK_WITHIN, 6)) {
        keyType = tWithin;
    } else if (0 == token.compare(PK_NOT, 3)) {
        keyType = tNot;
    } else if (0 == token.compare(PK_MOD, 3)) {
        keyType = tMod;
    } else if (0 == token.compare(PK_OR, 2)) {
        keyType = tOr;
    } else if (0 == token.compare(PK_DECIMAL, 7)) {
        keyType = tDecimal;
    } else if (0 == token.compare(PK_INTEGER, 7)) {
        keyType = tInteger;
    }
    return keyType;
}